

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::parseAreaLight(SemanticParser *this,SP *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  char *pcVar8;
  SP SVar9;
  vec2f v;
  string local_68;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 local_38;
  
  if ((in_RDX._M_pi)->_vptr__Sp_counted_base != (_func_int **)0x0) {
    iVar5 = std::__cxx11::string::compare((char *)((in_RDX._M_pi)->_vptr__Sp_counted_base + 7));
    if (iVar5 == 0) {
      pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
      paVar1 = &local_68.field_2;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"L","");
      bVar4 = syntactic::ParamSet::hasParam2f((ParamSet *)(pp_Var2 + 1),&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        std::__shared_ptr<pbrt::DiffuseAreaLightBB,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<pbrt::DiffuseAreaLightBB>>
                  ((__shared_ptr<pbrt::DiffuseAreaLightBB,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                   (allocator<pbrt::DiffuseAreaLightBB> *)&local_68);
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"L","");
        syntactic::ParamSet::getParam2f((ParamSet *)(pp_Var2 + 1),(float *)&local_38,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        (local_48->cameras).
        super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_38;
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nsamples","");
        iVar5 = syntactic::ParamSet::getParam1i((ParamSet *)(pp_Var2 + 1),&local_68,1);
        *(int *)((long)&(local_48->cameras).
                        super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                        ._M_impl.super__Vector_impl_data + 8) = iVar5;
        in_RDX._M_pi = extraout_RDX_00;
      }
      else {
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"L","");
        bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)(pp_Var2 + 1),&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (!bVar4) {
          poVar6 = (ostream *)&std::cout;
          pcVar8 = 
          "Warning: diffuse area light, but no \'L\' parameter, or L is neither two (blackbody) nor three (rgba) floats?! Ignoring."
          ;
          lVar7 = 0x76;
          goto LAB_0013716a;
        }
        std::__shared_ptr<pbrt::DiffuseAreaLightRGB,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<pbrt::DiffuseAreaLightRGB>>
                  ((__shared_ptr<pbrt::DiffuseAreaLightRGB,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                   (allocator<pbrt::DiffuseAreaLightRGB> *)&local_68);
        peVar3 = local_48;
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"L","");
        syntactic::ParamSet::getParam3f
                  ((ParamSet *)(pp_Var2 + 1),(float *)&peVar3->cameras,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pp_Var2 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nsamples","");
        iVar5 = syntactic::ParamSet::getParam1i((ParamSet *)(pp_Var2 + 1),&local_68,1);
        *(int *)((long)&(local_48->cameras).
                        super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                        ._M_impl.super__Vector_impl_data + 0xc) = iVar5;
        in_RDX._M_pi = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        in_RDX._M_pi = extraout_RDX_02;
      }
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_40;
      goto LAB_0013719c;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: unknown area light type \'",0x22);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)(in_RDX._M_pi)->_vptr__Sp_counted_base[7],
                        (long)(in_RDX._M_pi)->_vptr__Sp_counted_base[8]);
    pcVar8 = "\'.";
    lVar7 = 2;
LAB_0013716a:
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,lVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    in_RDX._M_pi = extraout_RDX;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0013719c:
  SVar9.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar9.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar9.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AreaLight::SP SemanticParser::parseAreaLight(pbrt::syntactic::AreaLightSource::SP in)
  {
    if (!in)
      return AreaLight::SP();

    if (in->type == "diffuse") {
      /*! parsing here is a bit more tricky, because the L parameter
          can be either an RGB, or a blackbody. Since the latter has
          two floats to the former's three floats we'll simply switch
          based on parameter count here .... */
      if (in->hasParam2f("L")) {
        DiffuseAreaLightBB::SP diffuse = std::make_shared<DiffuseAreaLightBB>();
        vec2f v;
        in->getParam2f(&v.x,"L");
        diffuse->temperature = v.x;
        diffuse->scale       = v.y;
        diffuse->nSamples = in->getParam1i("nsamples", 1);
        return diffuse;
      } else if (in->hasParam3f("L")) {
        DiffuseAreaLightRGB::SP diffuse = std::make_shared<DiffuseAreaLightRGB>();
        in->getParam3f(&diffuse->L.x,"L");
        diffuse->nSamples = in->getParam1i("nsamples", 1);
        return diffuse;
      } else {
        std::cout << "Warning: diffuse area light, but no 'L' parameter, or L is neither two (blackbody) nor three (rgba) floats?! Ignoring." << std::endl;
        return AreaLight::SP();
      }
      // auto L_it = in->param.find("L");
      // if (L_it == in->param.end()) {
      //   std::cout << "Warning: diffuse area light, but no 'L' parameter?! Ignoring." << std::endl;
      //   return AreaLight::SP();
      // }

      // syntactic::Param::SP param = L_it->second;
      // if (param->getType() == "blackbody") {
      //   // not blackbody - assume it's RGB
      //   DiffuseAreaLightBB::SP diffuse = std::make_shared<DiffuseAreaLightBB>();
        
      //   in->getParam3f(&diffuse->blackBody.x,"L");
      //   return diffuse;
      // } else {
      //   // not blackbody - assume it's RGB
      //   DiffuseAreaLightRGB::SP diffuse = std::make_shared<DiffuseAreaLightRGB>();
      //   in->getParam3f(&diffuse->blackBody.x,"L");
      //   return diffuse;
      // }
      
    }

    std::cout << "Warning: unknown area light type '" << in->type << "'." << std::endl;
    return AreaLight::SP();
  }